

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_flash_attn_ext
               (ggml_compute_params *params,ggml_tensor *q,ggml_tensor *k,ggml_tensor *v,
               ggml_tensor *mask,ggml_tensor *dst)

{
  void *pvVar1;
  undefined2 *puVar2;
  int *piVar3;
  uint *puVar4;
  size_t sVar5;
  float fVar6;
  int iVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  ggml_from_float_t p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  byte bVar25;
  uint uVar26;
  float fVar27;
  ggml_tensor *pgVar28;
  int iVar29;
  uint uVar30;
  size_t sVar31;
  size_t sVar32;
  size_t sVar33;
  ggml_type_traits_cpu *pgVar34;
  long lVar35;
  void *pvVar36;
  void *pvVar37;
  void *pvVar38;
  ulong uVar39;
  char *pcVar40;
  size_t __n;
  ulong uVar41;
  uint uVar42;
  long lVar43;
  long lVar44;
  undefined8 uVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  uint uVar49;
  ushort *puVar50;
  ggml_tensor *pgVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  bool bVar55;
  ushort uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  float fVar70;
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 extraout_var_03 [56];
  undefined1 auVar74 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar75 [64];
  undefined1 extraout_var_02 [60];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var_04 [56];
  undefined1 auVar76 [64];
  undefined1 in_XMM8 [16];
  int local_2a0;
  void *local_288;
  float local_24c;
  ulong local_248;
  long local_240;
  void *local_238;
  int64_t local_230;
  ggml_tensor *local_228;
  int64_t local_220;
  void *local_218;
  code *local_210;
  uint local_204;
  ggml_tensor *local_200;
  size_t local_1f8;
  long local_1f0;
  ggml_compute_params *local_1e8;
  size_t local_1e0;
  long local_1d8;
  ggml_tensor *local_1d0;
  int64_t local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  size_t local_160;
  size_t local_158;
  size_t local_150;
  size_t local_148;
  long local_140;
  ggml_from_float_t local_138;
  long local_130;
  int64_t local_128;
  size_t local_120;
  size_t local_118;
  size_t local_110;
  ggml_tensor *local_108;
  ggml_tensor *local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  ggml_vec_dot_t local_c8;
  size_t local_c0;
  long local_b8;
  void *local_b0;
  undefined1 local_a8 [64];
  float local_68;
  float local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_01 [60];
  
  local_1e8 = params;
  if (1 < (uint)dst->op_params[3]) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1bb5,"fatal error");
  }
  lVar8 = v->ne[0];
  if (dst->ne[0] == lVar8) {
    local_1f0 = q->ne[1];
    local_228 = v;
    local_100 = mask;
    if (dst->ne[2] == local_1f0) {
      local_110 = q->nb[1];
      local_118 = q->nb[2];
      local_230 = q->ne[0];
      sVar33 = k->nb[0];
      lVar35 = q->ne[2];
      lVar46 = q->ne[3];
      sVar32 = q->nb[0];
      uVar41 = dst->nb[2];
      local_120 = q->nb[3];
      lVar52 = k->ne[0];
      local_160 = v->nb[3];
      local_1c8 = k->ne[1];
      lVar47 = k->ne[2];
      local_a8._0_8_ = v->ne[3];
      local_1c0 = v->nb[1];
      local_220 = k->ne[3];
      local_c0 = k->nb[1];
      local_148 = k->nb[2];
      local_150 = k->nb[3];
      lVar54 = v->ne[2];
      sVar9 = v->nb[0];
      iVar29 = params->nth;
      local_158 = v->nb[2];
      sVar10 = dst->nb[0];
      local_128 = dst->ne[1];
      uVar39 = dst->nb[3];
      local_1f8 = dst->nb[1];
      iVar7 = params->ith;
      local_200 = dst;
      local_108 = q;
      sVar31 = ggml_type_size(q->type);
      if (sVar32 == sVar31) {
        local_1d0 = k;
        sVar32 = ggml_type_size(k->type);
        pgVar51 = local_228;
        if (sVar33 == sVar32) {
          sVar33 = ggml_type_size(local_228->type);
          lVar43 = local_1f0;
          auVar59._8_56_ = extraout_var_04;
          auVar59._0_8_ = extraout_XMM1_Qa;
          auVar72 = auVar59._0_16_;
          if (sVar9 == sVar33) {
            if (local_230 == lVar52) {
              if (sVar10 == 4) {
                if (local_1f8 < 4) {
                  pcVar40 = "nb0 <= nb1";
                  uVar45 = 0x1af2;
                }
                else if (uVar41 < local_1f8) {
                  pcVar40 = "nb1 <= nb2";
                  uVar45 = 0x1af3;
                }
                else if (uVar39 < uVar41) {
                  pcVar40 = "nb2 <= nb3";
                  uVar45 = 0x1af4;
                }
                else {
                  local_168 = lVar35 / lVar47;
                  local_170 = lVar46 / local_220;
                  local_178 = lVar35 / lVar54;
                  local_180 = lVar46 / (long)local_a8._0_8_;
                  local_130 = lVar35 * local_1f0;
                  iVar48 = (int)lVar46 * (int)local_130;
                  iVar29 = (iVar48 + -1 + iVar29) / iVar29;
                  local_1a8 = ZEXT416((uint)local_200->op_params[0]);
                  iVar53 = iVar29 * iVar7;
                  iVar29 = iVar29 + iVar53;
                  if (iVar48 <= iVar29) {
                    iVar29 = iVar48;
                  }
                  local_1b8 = ZEXT416((uint)local_200->op_params[1]);
                  fVar6 = (float)local_200->op_params[2];
                  auVar57 = vcvtusi2sd_avx512f(auVar72,(int)lVar35);
                  auVar60._0_8_ = log2(auVar57._0_8_);
                  auVar60._8_56_ = extraout_var_03;
                  auVar57 = vroundsd_avx(auVar60._0_16_,auVar60._0_16_,9);
                  uVar30 = vcvttsd2usi_avx512f(auVar57);
                  auVar57._8_4_ = 0x80000000;
                  auVar57._0_8_ = 0x8000000080000000;
                  auVar57._12_4_ = 0x80000000;
                  auVar57 = vxorps_avx512vl(local_1b8,auVar57);
                  local_204 = 1 << (uVar30 & 0x1f);
                  auVar72 = vcvtusi2ss_avx512f(auVar72,local_204);
                  local_58 = exp2f(auVar57._0_4_ / auVar72._0_4_);
                  local_68 = exp2f(((float)local_1b8._0_4_ * -0.5) / auVar72._0_4_);
                  pgVar28 = local_1d0;
                  pgVar34 = ggml_get_type_traits_cpu(local_1d0->type);
                  pgVar34 = ggml_get_type_traits_cpu(pgVar34->vec_dot_type);
                  p_Var11 = pgVar34->from_float;
                  pgVar34 = ggml_get_type_traits_cpu(pgVar28->type);
                  local_c8 = pgVar34->vec_dot;
                  lVar35 = ggml_get_type_traits(pgVar51->type);
                  local_138 = p_Var11;
                  if (p_Var11 == (ggml_from_float_t)0x0) {
                    pcVar40 = "( q_to_vec_dot) && \"fattn: unsupported K-type\"";
                    uVar45 = 0x1b20;
                  }
                  else {
                    local_210 = *(code **)(lVar35 + 0x28);
                    if (local_210 != (code *)0x0 || pgVar51->type == GGML_TYPE_F32) {
                      if (iVar53 < iVar29) {
                        local_1e0 = lVar8 * 2;
                        sVar5 = lVar8 * 4;
                        local_e0 = (long)iVar53;
                        uVar42 = (uint)lVar8;
                        local_1d8 = (long)(int)uVar42;
                        local_140 = (local_230 + 0x10 + lVar8 * 2) * (long)iVar7;
                        uVar30 = uVar42 & 0xffffffc0;
                        uVar41 = (ulong)uVar30;
                        uVar45 = vcmpss_avx512f(ZEXT416((uint)fVar6),ZEXT816(0) << 0x40,4);
                        bVar55 = (bool)((byte)uVar45 & 1);
                        local_240 = (long)(int)uVar30;
                        local_188 = local_240 * 4;
                        lVar35 = local_240 + 1;
                        if (local_240 + 1 <= local_1d8) {
                          lVar35 = local_1d8;
                        }
                        local_248 = (lVar35 - local_240) + 0xfU & 0xfffffffffffffff0;
                        auVar59 = vpbroadcastq_avx512f();
                        local_198 = local_240 * 2;
                        local_a8 = vmovdqu64_avx512f(auVar59);
                        local_190 = sVar5 + local_140 * 4 + local_240 * 4;
                        auVar76._16_48_ = auVar59._16_48_;
                        auVar76._0_16_ = local_1a8;
                        auVar61._4_60_ = auVar76._4_60_;
                        auVar61._0_4_ =
                             (uint)bVar55 * (int)(local_1a8._0_4_ / fVar6) +
                             (uint)!bVar55 * (int)local_1a8._0_4_;
                        local_1a8 = auVar61._0_16_;
                        do {
                          lVar35 = (long)(int)(local_e0 / local_130);
                          lVar46 = local_e0 - lVar35 * local_130;
                          local_220 = CONCAT44(local_220._4_4_,0x3f800000);
                          uVar49 = (uint)(lVar46 / lVar43);
                          if (0.0 < (float)local_1b8._0_4_) {
                            bVar55 = uVar49 < local_204;
                            uVar26 = (uVar49 - local_204) * 2;
                            if (bVar55) {
                              uVar26 = uVar49;
                            }
                            auVar72 = vcvtusi2ss_avx512f(in_XMM8,uVar26 + 1);
                            fVar70 = powf((float)((uint)bVar55 * (int)local_58 +
                                                 (uint)!bVar55 * (int)local_68),auVar72._0_4_);
                            local_220 = CONCAT44(local_220._4_4_,fVar70);
                          }
                          local_218 = local_1e8->wdata;
                          pvVar38 = (void *)((long)local_218 + local_140 * 4);
                          pvVar1 = (void *)((long)pvVar38 + lVar8 * 4);
                          __n = sVar5;
                          pvVar37 = pvVar38;
                          if (pgVar51->type == GGML_TYPE_F16) {
                            __n = local_1e0;
                            pvVar37 = pvVar1;
                          }
                          memset(pvVar37,0,__n);
                          local_2a0 = (int)(lVar46 % lVar43);
                          if (local_100 == (ggml_tensor *)0x0) {
                            local_288 = (void *)0x0;
                          }
                          else {
                            local_288 = (void *)(local_100->nb[1] * (long)local_2a0 +
                                                (long)local_100->data);
                          }
                          local_f0 = (long)local_2a0;
                          lVar52 = (long)(int)uVar49;
                          local_b0 = (void *)((long)pvVar38 + local_1e0 * 4);
                          (*local_138)((float *)((long)local_108->data +
                                                lVar52 * local_118 +
                                                lVar35 * local_120 + local_f0 * local_110),local_b0,
                                       local_230);
                          lVar46 = local_240;
                          local_238 = pvVar38;
                          local_f8 = lVar52;
                          local_e8 = lVar35;
                          if (local_1c8 < 1) {
                            auVar59 = vmovdqu64_avx512f(local_a8);
                            auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            fVar70 = 0.0;
                          }
                          else {
                            auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                            auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                            auVar76 = ZEXT864(0);
                            local_d0 = (long)(int)(lVar52 / local_178) * local_158;
                            auVar59 = vmovdqu64_avx512f(local_a8);
                            fVar27 = -INFINITY;
                            local_b8 = (long)(int)(lVar35 / local_170) * local_150 +
                                       (long)(int)(lVar52 / local_168) * local_148;
                            local_d8 = (long)(int)(lVar35 / local_180) * local_160;
                            local_218 = (void *)((long)local_218 + local_190);
                            lVar54 = 0;
                            lVar35 = local_d8 + local_d0;
                            lVar47 = local_198 + local_d8 + local_d0;
                            lVar52 = lVar35 + local_188;
                            do {
                              fVar70 = 0.0;
                              if (local_288 == (void *)0x0) {
LAB_001443f9:
                                (*local_c8)((int)local_230,&local_24c,0,
                                            (void *)((long)local_1d0->data +
                                                    local_b8 + lVar54 * local_c0),0,local_b0,0,1);
                                fVar71 = (float)local_1a8._0_4_ * local_24c;
                                if ((fVar6 != 0.0) || (NAN(fVar6))) {
                                  fVar71 = tanhf(fVar71);
                                  fVar71 = fVar71 * fVar6;
                                }
                                fVar71 = fVar71 + fVar70;
                                pvVar37 = local_228->data;
                                local_24c = fVar71;
                                if (local_228->type == GGML_TYPE_F16) {
                                  if (fVar71 <= fVar27) {
                                    auVar75._0_4_ = expf(fVar71 - fVar27);
                                    auVar75._4_60_ = extraout_var_01;
                                    auVar57 = SUB6416(ZEXT464(0x3f800000),0);
                                    auVar59 = vmovdqu64_avx512f(local_a8);
                                    auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar72 = auVar75._0_16_;
                                  }
                                  else {
                                    auVar74._0_4_ = expf(fVar27 - fVar71);
                                    auVar74._4_60_ = extraout_var;
                                    auVar59 = vmovdqu64_avx512f(local_a8);
                                    auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar57 = auVar74._0_16_;
                                    if (0 < (int)uVar30) {
                                      auVar62 = vbroadcastss_avx512f(auVar57);
                                      uVar39 = 0;
                                      pvVar36 = pvVar1;
                                      do {
                                        lVar43 = 0;
                                        do {
                                          auVar63 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                       ((long)pvVar36 + lVar43));
                                          auVar63 = vmulps_avx512f(auVar62,auVar63);
                                          puVar2 = (undefined2 *)((long)pvVar36 + lVar43);
                                          auVar58 = vcvtps2ph_avx512f(auVar63,0);
                                          *puVar2 = auVar58._0_2_;
                                          puVar2[1] = auVar58._2_2_;
                                          puVar2[2] = auVar58._4_2_;
                                          puVar2[3] = auVar58._6_2_;
                                          puVar2[4] = auVar58._8_2_;
                                          puVar2[5] = auVar58._10_2_;
                                          puVar2[6] = auVar58._12_2_;
                                          puVar2[7] = auVar58._14_2_;
                                          puVar2[8] = auVar58._16_2_;
                                          puVar2[9] = auVar58._18_2_;
                                          puVar2[10] = auVar58._20_2_;
                                          puVar2[0xb] = auVar58._22_2_;
                                          puVar2[0xc] = auVar58._24_2_;
                                          puVar2[0xd] = auVar58._26_2_;
                                          puVar2[0xe] = auVar58._28_2_;
                                          puVar2[0xf] = auVar58._30_2_;
                                          lVar43 = lVar43 + 0x20;
                                        } while (lVar43 != 0x80);
                                        uVar39 = uVar39 + 0x40;
                                        pvVar36 = (void *)((long)pvVar36 + 0x80);
                                      } while (uVar39 < uVar41);
                                    }
                                    lVar43 = local_240;
                                    if (uVar30 != uVar42) {
                                      do {
                                        auVar72 = vcvtps2ph_f16c(ZEXT416((uint)(auVar74._0_4_ *
                                                                               *(float *)(&
                                                  ggml_table_f32_f16 +
                                                  (ulong)*(ushort *)((long)pvVar1 + lVar43 * 2) * 4)
                                                  )),0);
                                        vpextrw_avx(auVar72,0);
                                        lVar43 = lVar43 + 1;
                                      } while (lVar43 < local_1d8);
                                    }
                                    auVar72 = SUB6416(ZEXT464(0x3f800000),0);
                                    fVar27 = fVar71;
                                  }
                                  if (0 < (int)uVar30) {
                                    auVar62 = vbroadcastss_avx512f(auVar72);
                                    lVar43 = (long)pvVar37 + lVar35;
                                    uVar39 = 0;
                                    pvVar36 = pvVar1;
                                    do {
                                      lVar44 = 0;
                                      do {
                                        auVar63 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                     (lVar43 + lVar44));
                                        auVar64 = vcvtph2ps_avx512f(*(undefined1 (*) [32])
                                                                     ((long)pvVar36 + lVar44));
                                        auVar63 = vfmadd231ps_avx512f(auVar64,auVar62,auVar63);
                                        puVar2 = (undefined2 *)((long)pvVar36 + lVar44);
                                        auVar58 = vcvtps2ph_avx512f(auVar63,0);
                                        *puVar2 = auVar58._0_2_;
                                        puVar2[1] = auVar58._2_2_;
                                        puVar2[2] = auVar58._4_2_;
                                        puVar2[3] = auVar58._6_2_;
                                        puVar2[4] = auVar58._8_2_;
                                        puVar2[5] = auVar58._10_2_;
                                        puVar2[6] = auVar58._12_2_;
                                        puVar2[7] = auVar58._14_2_;
                                        puVar2[8] = auVar58._16_2_;
                                        puVar2[9] = auVar58._18_2_;
                                        puVar2[10] = auVar58._20_2_;
                                        puVar2[0xb] = auVar58._22_2_;
                                        puVar2[0xc] = auVar58._24_2_;
                                        puVar2[0xd] = auVar58._26_2_;
                                        puVar2[0xe] = auVar58._28_2_;
                                        puVar2[0xf] = auVar58._30_2_;
                                        lVar44 = lVar44 + 0x20;
                                      } while (lVar44 != 0x80);
                                      uVar39 = uVar39 + 0x40;
                                      pvVar36 = (void *)((long)pvVar36 + 0x80);
                                      lVar43 = lVar43 + 0x80;
                                    } while (uVar39 < uVar41);
                                  }
                                  if (uVar30 != uVar42) {
                                    puVar50 = (ushort *)((long)pvVar37 + lVar47);
                                    lVar43 = local_240;
                                    do {
                                      uVar56 = *puVar50;
                                      puVar50 = puVar50 + 1;
                                      auVar73 = vfmadd213ss_fma(ZEXT416(*(uint *)(&
                                                  ggml_table_f32_f16 + (ulong)uVar56 * 4)),auVar72,
                                                  ZEXT416(*(uint *)(&ggml_table_f32_f16 +
                                                                   (ulong)*(ushort *)
                                                                           ((long)pvVar1 +
                                                                           lVar43 * 2) * 4)));
                                      auVar73 = vcvtps2ph_f16c(auVar73,0);
                                      vpextrw_avx(auVar73,0);
                                      lVar43 = lVar43 + 1;
                                    } while (lVar43 < local_1d8);
                                  }
                                }
                                else {
                                  if (fVar71 <= fVar27) {
                                    auVar62._0_4_ = expf(fVar71 - fVar27);
                                    auVar62._4_60_ = extraout_var_02;
                                    auVar57 = SUB6416(ZEXT464(0x3f800000),0);
                                    auVar59 = vmovdqu64_avx512f(local_a8);
                                    auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar72 = auVar62._0_16_;
                                  }
                                  else {
                                    auVar63._0_4_ = expf(fVar27 - fVar71);
                                    auVar63._4_60_ = extraout_var_00;
                                    auVar59 = vmovdqu64_avx512f(local_a8);
                                    auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar57 = auVar63._0_16_;
                                    if (0 < (int)uVar30) {
                                      auVar62 = vbroadcastss_avx512f(auVar57);
                                      uVar39 = 0;
                                      pvVar36 = local_238;
                                      do {
                                        lVar43 = 0;
                                        do {
                                          auVar63 = vmulps_avx512f(auVar62,*(undefined1 (*) [64])
                                                                            ((long)pvVar36 + lVar43)
                                                                  );
                                          *(undefined1 (*) [64])((long)pvVar36 + lVar43) = auVar63;
                                          lVar43 = lVar43 + 0x40;
                                        } while (lVar43 != 0x100);
                                        uVar39 = uVar39 + 0x40;
                                        pvVar36 = (void *)((long)pvVar36 + 0x100);
                                      } while (uVar39 < uVar41);
                                    }
                                    if (uVar30 != uVar42) {
                                      auVar62 = vbroadcastss_avx512f(auVar57);
                                      uVar39 = 0;
                                      do {
                                        auVar63 = vpbroadcastq_avx512f();
                                        auVar64 = vporq_avx512f(auVar63,auVar60);
                                        auVar63 = vporq_avx512f(auVar63,auVar61);
                                        uVar45 = vpcmpuq_avx512f(auVar63,auVar59,2);
                                        bVar24 = (byte)uVar45;
                                        uVar45 = vpcmpuq_avx512f(auVar64,auVar59,2);
                                        bVar25 = (byte)uVar45;
                                        uVar56 = CONCAT11(bVar25,bVar24);
                                        piVar3 = (int *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        auVar64._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                                        auVar64._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                                        auVar64._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                                        auVar64._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar64._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar64._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar64._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar64._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar64._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                                        auVar64._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                                        auVar64._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                                        auVar64._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                                        auVar64._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                                        auVar64._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                                        auVar64._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                                        auVar64._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                                        auVar63 = vmulps_avx512f(auVar62,auVar64);
                                        puVar4 = (uint *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        bVar55 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar14 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar15 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar17 = (bool)((byte)(uVar56 >> 7) & 1);
                                        bVar18 = (bool)(bVar25 >> 1 & 1);
                                        bVar19 = (bool)(bVar25 >> 2 & 1);
                                        bVar20 = (bool)(bVar25 >> 3 & 1);
                                        bVar21 = (bool)(bVar25 >> 4 & 1);
                                        bVar22 = (bool)(bVar25 >> 5 & 1);
                                        bVar23 = (bool)(bVar25 >> 6 & 1);
                                        *puVar4 = (uint)(bVar24 & 1) * auVar63._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * *puVar4;
                                        puVar4[1] = (uint)bVar55 * auVar63._4_4_ |
                                                    (uint)!bVar55 * puVar4[1];
                                        puVar4[2] = (uint)bVar12 * auVar63._8_4_ |
                                                    (uint)!bVar12 * puVar4[2];
                                        puVar4[3] = (uint)bVar13 * auVar63._12_4_ |
                                                    (uint)!bVar13 * puVar4[3];
                                        puVar4[4] = (uint)bVar14 * auVar63._16_4_ |
                                                    (uint)!bVar14 * puVar4[4];
                                        puVar4[5] = (uint)bVar15 * auVar63._20_4_ |
                                                    (uint)!bVar15 * puVar4[5];
                                        puVar4[6] = (uint)bVar16 * auVar63._24_4_ |
                                                    (uint)!bVar16 * puVar4[6];
                                        puVar4[7] = (uint)bVar17 * auVar63._28_4_ |
                                                    (uint)!bVar17 * puVar4[7];
                                        puVar4[8] = (uint)(bVar25 & 1) * auVar63._32_4_ |
                                                    (uint)!(bool)(bVar25 & 1) * puVar4[8];
                                        puVar4[9] = (uint)bVar18 * auVar63._36_4_ |
                                                    (uint)!bVar18 * puVar4[9];
                                        puVar4[10] = (uint)bVar19 * auVar63._40_4_ |
                                                     (uint)!bVar19 * puVar4[10];
                                        puVar4[0xb] = (uint)bVar20 * auVar63._44_4_ |
                                                      (uint)!bVar20 * puVar4[0xb];
                                        puVar4[0xc] = (uint)bVar21 * auVar63._48_4_ |
                                                      (uint)!bVar21 * puVar4[0xc];
                                        puVar4[0xd] = (uint)bVar22 * auVar63._52_4_ |
                                                      (uint)!bVar22 * puVar4[0xd];
                                        puVar4[0xe] = (uint)bVar23 * auVar63._56_4_ |
                                                      (uint)!bVar23 * puVar4[0xe];
                                        puVar4[0xf] = (uint)(bVar25 >> 7) * auVar63._60_4_ |
                                                      (uint)!(bool)(bVar25 >> 7) * puVar4[0xf];
                                        uVar39 = uVar39 + 0x10;
                                      } while (local_248 != uVar39);
                                    }
                                    auVar72 = SUB6416(ZEXT464(0x3f800000),0);
                                    fVar27 = fVar71;
                                  }
                                  if (local_210 == (code *)0x0) {
                                    auVar62 = vbroadcastss_avx512f(auVar72);
                                    if (0 < (int)uVar30) {
                                      lVar43 = (long)pvVar37 + lVar35;
                                      uVar39 = 0;
                                      pvVar36 = local_238;
                                      do {
                                        lVar44 = 0;
                                        do {
                                          auVar63 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                         (lVar43 + lVar44),auVar62,
                                                                        *(undefined1 (*) [64])
                                                                         ((long)pvVar36 + lVar44));
                                          *(undefined1 (*) [64])((long)pvVar36 + lVar44) = auVar63;
                                          lVar44 = lVar44 + 0x40;
                                        } while (lVar44 != 0x100);
                                        uVar39 = uVar39 + 0x40;
                                        pvVar36 = (void *)((long)pvVar36 + 0x100);
                                        lVar43 = lVar43 + 0x100;
                                      } while (uVar39 < uVar41);
                                    }
                                    if (uVar30 != uVar42) {
                                      uVar39 = 0;
                                      do {
                                        auVar63 = vpbroadcastq_avx512f();
                                        auVar64 = vporq_avx512f(auVar63,auVar60);
                                        auVar63 = vporq_avx512f(auVar63,auVar61);
                                        uVar45 = vpcmpuq_avx512f(auVar63,auVar59,2);
                                        bVar24 = (byte)uVar45;
                                        uVar45 = vpcmpuq_avx512f(auVar64,auVar59,2);
                                        bVar25 = (byte)uVar45;
                                        uVar56 = CONCAT11(bVar25,bVar24);
                                        piVar3 = (int *)((long)pvVar37 + uVar39 * 4 + lVar52);
                                        auVar67._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                                        auVar67._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                                        auVar67._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                                        auVar67._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar67._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar67._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar67._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar67._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar67._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                                        auVar67._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                                        auVar67._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                                        auVar67._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                                        auVar67._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                                        auVar67._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                                        auVar67._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                                        auVar67._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                                        piVar3 = (int *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        auVar68._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                                        auVar68._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                                        auVar68._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                                        auVar68._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar68._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar68._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar68._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar68._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar68._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                                        auVar68._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                                        auVar68._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                                        auVar68._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                                        auVar68._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                                        auVar68._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                                        auVar68._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                                        auVar68._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                                        auVar63 = vfmadd231ps_avx512f(auVar68,auVar62,auVar67);
                                        puVar4 = (uint *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        bVar55 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar14 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar15 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar17 = (bool)((byte)(uVar56 >> 7) & 1);
                                        bVar18 = (bool)(bVar25 >> 1 & 1);
                                        bVar19 = (bool)(bVar25 >> 2 & 1);
                                        bVar20 = (bool)(bVar25 >> 3 & 1);
                                        bVar21 = (bool)(bVar25 >> 4 & 1);
                                        bVar22 = (bool)(bVar25 >> 5 & 1);
                                        bVar23 = (bool)(bVar25 >> 6 & 1);
                                        *puVar4 = (uint)(bVar24 & 1) * auVar63._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * *puVar4;
                                        puVar4[1] = (uint)bVar55 * auVar63._4_4_ |
                                                    (uint)!bVar55 * puVar4[1];
                                        puVar4[2] = (uint)bVar12 * auVar63._8_4_ |
                                                    (uint)!bVar12 * puVar4[2];
                                        puVar4[3] = (uint)bVar13 * auVar63._12_4_ |
                                                    (uint)!bVar13 * puVar4[3];
                                        puVar4[4] = (uint)bVar14 * auVar63._16_4_ |
                                                    (uint)!bVar14 * puVar4[4];
                                        puVar4[5] = (uint)bVar15 * auVar63._20_4_ |
                                                    (uint)!bVar15 * puVar4[5];
                                        puVar4[6] = (uint)bVar16 * auVar63._24_4_ |
                                                    (uint)!bVar16 * puVar4[6];
                                        puVar4[7] = (uint)bVar17 * auVar63._28_4_ |
                                                    (uint)!bVar17 * puVar4[7];
                                        puVar4[8] = (uint)(bVar25 & 1) * auVar63._32_4_ |
                                                    (uint)!(bool)(bVar25 & 1) * puVar4[8];
                                        puVar4[9] = (uint)bVar18 * auVar63._36_4_ |
                                                    (uint)!bVar18 * puVar4[9];
                                        puVar4[10] = (uint)bVar19 * auVar63._40_4_ |
                                                     (uint)!bVar19 * puVar4[10];
                                        puVar4[0xb] = (uint)bVar20 * auVar63._44_4_ |
                                                      (uint)!bVar20 * puVar4[0xb];
                                        puVar4[0xc] = (uint)bVar21 * auVar63._48_4_ |
                                                      (uint)!bVar21 * puVar4[0xc];
                                        puVar4[0xd] = (uint)bVar22 * auVar63._52_4_ |
                                                      (uint)!bVar22 * puVar4[0xd];
                                        puVar4[0xe] = (uint)bVar23 * auVar63._56_4_ |
                                                      (uint)!bVar23 * puVar4[0xe];
                                        puVar4[0xf] = (uint)(bVar25 >> 7) * auVar63._60_4_ |
                                                      (uint)!(bool)(bVar25 >> 7) * puVar4[0xf];
                                        uVar39 = uVar39 + 0x10;
                                      } while (local_248 != uVar39);
                                    }
                                  }
                                  else {
                                    local_48 = auVar72;
                                    (*local_210)((long)pvVar37 +
                                                 lVar54 * local_1c0 + local_d0 + local_d8);
                                    auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                                    auVar60 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                                    auVar59 = vmovdqu64_avx512f(local_a8);
                                    auVar62 = vbroadcastss_avx512f(local_48);
                                    if (0 < (int)uVar30) {
                                      uVar39 = 0;
                                      pvVar37 = local_238;
                                      do {
                                        lVar43 = 0;
                                        do {
                                          auVar63 = vfmadd213ps_avx512f(*(undefined1 (*) [64])
                                                                         ((long)pvVar37 +
                                                                         lVar43 + sVar5),auVar62,
                                                                        *(undefined1 (*) [64])
                                                                         ((long)pvVar37 + lVar43));
                                          *(undefined1 (*) [64])((long)pvVar37 + lVar43) = auVar63;
                                          lVar43 = lVar43 + 0x40;
                                        } while (lVar43 != 0x100);
                                        uVar39 = uVar39 + 0x40;
                                        pvVar37 = (void *)((long)pvVar37 + 0x100);
                                      } while (uVar39 < uVar41);
                                    }
                                    auVar72 = local_48;
                                    if (uVar30 != uVar42) {
                                      uVar39 = 0;
                                      do {
                                        auVar63 = vpbroadcastq_avx512f();
                                        auVar64 = vporq_avx512f(auVar63,auVar60);
                                        auVar63 = vporq_avx512f(auVar63,auVar61);
                                        uVar45 = vpcmpuq_avx512f(auVar63,auVar59,2);
                                        bVar24 = (byte)uVar45;
                                        uVar45 = vpcmpuq_avx512f(auVar64,auVar59,2);
                                        bVar25 = (byte)uVar45;
                                        uVar56 = CONCAT11(bVar25,bVar24);
                                        piVar3 = (int *)((long)local_218 + uVar39 * 4);
                                        auVar65._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                                        auVar65._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                                        auVar65._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                                        auVar65._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar65._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar65._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar65._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar65._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar65._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                                        auVar65._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                                        auVar65._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                                        auVar65._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                                        auVar65._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                                        auVar65._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                                        auVar65._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                                        auVar65._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                                        piVar3 = (int *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        auVar66._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                                        auVar66._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                                        auVar66._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                                        auVar66._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3]
                                        ;
                                        auVar66._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4]
                                        ;
                                        auVar66._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5]
                                        ;
                                        auVar66._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6]
                                        ;
                                        auVar66._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7]
                                        ;
                                        auVar66._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                                        auVar66._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                                        auVar66._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                                        auVar66._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                                        auVar66._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                                        auVar66._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                                        auVar66._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                                        auVar66._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                                        auVar63 = vfmadd231ps_avx512f(auVar66,auVar62,auVar65);
                                        puVar4 = (uint *)((long)pvVar38 + uVar39 * 4 + lVar46 * 4);
                                        bVar55 = (bool)((byte)(uVar56 >> 1) & 1);
                                        bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                                        bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                                        bVar14 = (bool)((byte)(uVar56 >> 4) & 1);
                                        bVar15 = (bool)((byte)(uVar56 >> 5) & 1);
                                        bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                                        bVar17 = (bool)((byte)(uVar56 >> 7) & 1);
                                        bVar18 = (bool)(bVar25 >> 1 & 1);
                                        bVar19 = (bool)(bVar25 >> 2 & 1);
                                        bVar20 = (bool)(bVar25 >> 3 & 1);
                                        bVar21 = (bool)(bVar25 >> 4 & 1);
                                        bVar22 = (bool)(bVar25 >> 5 & 1);
                                        bVar23 = (bool)(bVar25 >> 6 & 1);
                                        *puVar4 = (uint)(bVar24 & 1) * auVar63._0_4_ |
                                                  (uint)!(bool)(bVar24 & 1) * *puVar4;
                                        puVar4[1] = (uint)bVar55 * auVar63._4_4_ |
                                                    (uint)!bVar55 * puVar4[1];
                                        puVar4[2] = (uint)bVar12 * auVar63._8_4_ |
                                                    (uint)!bVar12 * puVar4[2];
                                        puVar4[3] = (uint)bVar13 * auVar63._12_4_ |
                                                    (uint)!bVar13 * puVar4[3];
                                        puVar4[4] = (uint)bVar14 * auVar63._16_4_ |
                                                    (uint)!bVar14 * puVar4[4];
                                        puVar4[5] = (uint)bVar15 * auVar63._20_4_ |
                                                    (uint)!bVar15 * puVar4[5];
                                        puVar4[6] = (uint)bVar16 * auVar63._24_4_ |
                                                    (uint)!bVar16 * puVar4[6];
                                        puVar4[7] = (uint)bVar17 * auVar63._28_4_ |
                                                    (uint)!bVar17 * puVar4[7];
                                        puVar4[8] = (uint)(bVar25 & 1) * auVar63._32_4_ |
                                                    (uint)!(bool)(bVar25 & 1) * puVar4[8];
                                        puVar4[9] = (uint)bVar18 * auVar63._36_4_ |
                                                    (uint)!bVar18 * puVar4[9];
                                        puVar4[10] = (uint)bVar19 * auVar63._40_4_ |
                                                     (uint)!bVar19 * puVar4[10];
                                        puVar4[0xb] = (uint)bVar20 * auVar63._44_4_ |
                                                      (uint)!bVar20 * puVar4[0xb];
                                        puVar4[0xc] = (uint)bVar21 * auVar63._48_4_ |
                                                      (uint)!bVar21 * puVar4[0xc];
                                        puVar4[0xd] = (uint)bVar22 * auVar63._52_4_ |
                                                      (uint)!bVar22 * puVar4[0xd];
                                        puVar4[0xe] = (uint)bVar23 * auVar63._56_4_ |
                                                      (uint)!bVar23 * puVar4[0xe];
                                        puVar4[0xf] = (uint)(bVar25 >> 7) * auVar63._60_4_ |
                                                      (uint)!(bool)(bVar25 >> 7) * puVar4[0xf];
                                        uVar39 = uVar39 + 0x10;
                                      } while (local_248 != uVar39);
                                    }
                                  }
                                }
                                auVar72 = vfmadd213ss_fma(auVar57,ZEXT416(auVar76._0_4_),auVar72);
                                auVar76 = ZEXT1664(auVar72);
                              }
                              else {
                                fVar70 = (float)local_220 *
                                         *(float *)(&ggml_table_f32_f16 +
                                                   (ulong)*(ushort *)((long)local_288 + lVar54 * 2)
                                                   * 4);
                                if (-INFINITY < fVar70) goto LAB_001443f9;
                              }
                              fVar70 = auVar76._0_4_;
                              lVar54 = lVar54 + 1;
                              lVar35 = lVar35 + local_1c0;
                              lVar52 = lVar52 + local_1c0;
                              lVar47 = lVar47 + local_1c0;
                            } while (lVar54 != local_1c8);
                          }
                          lVar43 = local_1f0;
                          pgVar51 = local_228;
                          if ((0 < lVar8) && (local_228->type == GGML_TYPE_F16)) {
                            lVar35 = 0;
                            do {
                              *(undefined4 *)((long)local_238 + lVar35 * 4) =
                                   *(undefined4 *)
                                    (&ggml_table_f32_f16 +
                                    (ulong)*(ushort *)((long)local_238 + lVar35 * 2 + sVar5) * 4);
                              lVar35 = lVar35 + 1;
                            } while (lVar8 != lVar35);
                          }
                          auVar72._0_4_ = 1.0 / fVar70;
                          auVar72._4_12_ = SUB6012((undefined1  [60])0x0,0);
                          auVar76 = vbroadcastss_avx512f(auVar72);
                          if (0 < (int)uVar30) {
                            uVar39 = 0;
                            pvVar38 = local_238;
                            do {
                              lVar35 = 0;
                              do {
                                auVar62 = vmulps_avx512f(auVar76,*(undefined1 (*) [64])
                                                                  ((long)pvVar38 + lVar35));
                                *(undefined1 (*) [64])((long)pvVar38 + lVar35) = auVar62;
                                lVar35 = lVar35 + 0x40;
                              } while (lVar35 != 0x100);
                              uVar39 = uVar39 + 0x40;
                              pvVar38 = (void *)((long)pvVar38 + 0x100);
                            } while (uVar39 < uVar41);
                          }
                          if (uVar30 != uVar42) {
                            uVar39 = 0;
                            do {
                              auVar62 = vpbroadcastq_avx512f();
                              auVar63 = vporq_avx512f(auVar62,auVar60);
                              auVar62 = vporq_avx512f(auVar62,auVar61);
                              uVar45 = vpcmpuq_avx512f(auVar62,auVar59,2);
                              bVar24 = (byte)uVar45;
                              uVar45 = vpcmpuq_avx512f(auVar63,auVar59,2);
                              bVar25 = (byte)uVar45;
                              uVar56 = CONCAT11(bVar25,bVar24);
                              piVar3 = (int *)((long)local_238 + uVar39 * 4 + local_240 * 4);
                              auVar69._4_4_ = (uint)((byte)(uVar56 >> 1) & 1) * piVar3[1];
                              auVar69._0_4_ = (uint)(bVar24 & 1) * *piVar3;
                              auVar69._8_4_ = (uint)((byte)(uVar56 >> 2) & 1) * piVar3[2];
                              auVar69._12_4_ = (uint)((byte)(uVar56 >> 3) & 1) * piVar3[3];
                              auVar69._16_4_ = (uint)((byte)(uVar56 >> 4) & 1) * piVar3[4];
                              auVar69._20_4_ = (uint)((byte)(uVar56 >> 5) & 1) * piVar3[5];
                              auVar69._24_4_ = (uint)((byte)(uVar56 >> 6) & 1) * piVar3[6];
                              auVar69._28_4_ = (uint)((byte)(uVar56 >> 7) & 1) * piVar3[7];
                              auVar69._32_4_ = (uint)(bVar25 & 1) * piVar3[8];
                              auVar69._36_4_ = (uint)(bVar25 >> 1 & 1) * piVar3[9];
                              auVar69._40_4_ = (uint)(bVar25 >> 2 & 1) * piVar3[10];
                              auVar69._44_4_ = (uint)(bVar25 >> 3 & 1) * piVar3[0xb];
                              auVar69._48_4_ = (uint)(bVar25 >> 4 & 1) * piVar3[0xc];
                              auVar69._52_4_ = (uint)(bVar25 >> 5 & 1) * piVar3[0xd];
                              auVar69._56_4_ = (uint)(bVar25 >> 6 & 1) * piVar3[0xe];
                              auVar69._60_4_ = (uint)(bVar25 >> 7) * piVar3[0xf];
                              auVar62 = vmulps_avx512f(auVar76,auVar69);
                              puVar4 = (uint *)((long)local_238 + uVar39 * 4 + local_240 * 4);
                              bVar55 = (bool)((byte)(uVar56 >> 1) & 1);
                              bVar12 = (bool)((byte)(uVar56 >> 2) & 1);
                              bVar13 = (bool)((byte)(uVar56 >> 3) & 1);
                              bVar14 = (bool)((byte)(uVar56 >> 4) & 1);
                              bVar15 = (bool)((byte)(uVar56 >> 5) & 1);
                              bVar16 = (bool)((byte)(uVar56 >> 6) & 1);
                              bVar17 = (bool)((byte)(uVar56 >> 7) & 1);
                              bVar18 = (bool)(bVar25 >> 1 & 1);
                              bVar19 = (bool)(bVar25 >> 2 & 1);
                              bVar20 = (bool)(bVar25 >> 3 & 1);
                              bVar21 = (bool)(bVar25 >> 4 & 1);
                              bVar22 = (bool)(bVar25 >> 5 & 1);
                              bVar23 = (bool)(bVar25 >> 6 & 1);
                              *puVar4 = (uint)(bVar24 & 1) * auVar62._0_4_ |
                                        (uint)!(bool)(bVar24 & 1) * *puVar4;
                              puVar4[1] = (uint)bVar55 * auVar62._4_4_ | (uint)!bVar55 * puVar4[1];
                              puVar4[2] = (uint)bVar12 * auVar62._8_4_ | (uint)!bVar12 * puVar4[2];
                              puVar4[3] = (uint)bVar13 * auVar62._12_4_ | (uint)!bVar13 * puVar4[3];
                              puVar4[4] = (uint)bVar14 * auVar62._16_4_ | (uint)!bVar14 * puVar4[4];
                              puVar4[5] = (uint)bVar15 * auVar62._20_4_ | (uint)!bVar15 * puVar4[5];
                              puVar4[6] = (uint)bVar16 * auVar62._24_4_ | (uint)!bVar16 * puVar4[6];
                              puVar4[7] = (uint)bVar17 * auVar62._28_4_ | (uint)!bVar17 * puVar4[7];
                              puVar4[8] = (uint)(bVar25 & 1) * auVar62._32_4_ |
                                          (uint)!(bool)(bVar25 & 1) * puVar4[8];
                              puVar4[9] = (uint)bVar18 * auVar62._36_4_ | (uint)!bVar18 * puVar4[9];
                              puVar4[10] = (uint)bVar19 * auVar62._40_4_ |
                                           (uint)!bVar19 * puVar4[10];
                              puVar4[0xb] = (uint)bVar20 * auVar62._44_4_ |
                                            (uint)!bVar20 * puVar4[0xb];
                              puVar4[0xc] = (uint)bVar21 * auVar62._48_4_ |
                                            (uint)!bVar21 * puVar4[0xc];
                              puVar4[0xd] = (uint)bVar22 * auVar62._52_4_ |
                                            (uint)!bVar22 * puVar4[0xd];
                              puVar4[0xe] = (uint)bVar23 * auVar62._56_4_ |
                                            (uint)!bVar23 * puVar4[0xe];
                              puVar4[0xf] = (uint)(bVar25 >> 7) * auVar62._60_4_ |
                                            (uint)!(bool)(bVar25 >> 7) * puVar4[0xf];
                              uVar39 = uVar39 + 0x10;
                            } while (local_248 != uVar39);
                          }
                          memcpy((void *)(((local_f0 + local_e8 * local_1f0) * local_128 + local_f8)
                                          * local_1f8 + (long)local_200->data),local_238,local_1f8);
                          local_e0 = local_e0 + 1;
                        } while (iVar29 != (int)local_e0);
                      }
                      return;
                    }
                    pcVar40 = 
                    "(v->type == GGML_TYPE_F32 || v_to_float ) && \"fattn: unsupported V-type\"";
                    uVar45 = 0x1b21;
                  }
                }
              }
              else {
                pcVar40 = "nb0 == sizeof(float)";
                uVar45 = 0x1af1;
              }
            }
            else {
              pcVar40 = "neq0 == DK";
              uVar45 = 0x1aea;
            }
          }
          else {
            pcVar40 = "nbv0 == ggml_type_size(v->type)";
            uVar45 = 0x1ae8;
          }
        }
        else {
          pcVar40 = "nbk0 == ggml_type_size(k->type)";
          uVar45 = 0x1ae7;
        }
      }
      else {
        pcVar40 = "nbq0 == ggml_type_size(q->type)";
        uVar45 = 0x1ae6;
      }
    }
    else {
      pcVar40 = "ne2 == N";
      uVar45 = 0x1ae3;
    }
  }
  else {
    pcVar40 = "ne0 == DV";
    uVar45 = 0x1ae2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar45,"GGML_ASSERT(%s) failed",pcVar40);
}

Assistant:

void ggml_compute_forward_flash_attn_ext(
        const ggml_compute_params * params,
        const ggml_tensor * q,
        const ggml_tensor * k,
        const ggml_tensor * v,
        const ggml_tensor * mask,
        ggml_tensor * dst) {
    switch (dst->op_params[3]) {
        case GGML_PREC_DEFAULT:
        case GGML_PREC_F32:
            {
                // uses F32 accumulators
                ggml_compute_forward_flash_attn_ext_f16(params, q, k, v, mask, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}